

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorAngle.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsMotorAngle::ChShaftsMotorAngle(ChShaftsMotorAngle *this,ChShaftsMotorAngle *other)

{
  undefined1 auVar1 [64];
  
  ChShaftsCouple::ChShaftsCouple((ChShaftsCouple *)this);
  (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChShaftsMotorAngle_0116f318;
  (this->f_rot).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->f_rot).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.c_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.l_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.b_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.cfm_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.valid = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.disabled = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.redundant = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.broken = false;
  this->violation = 0.0;
  this->motor_torque = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.active = true;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.g_i = 0.0;
  (this->constraint).super_ChConstraintTwo.variables_a = (ChVariables *)0x0;
  (this->constraint).super_ChConstraintTwo.variables_b = (ChVariables *)0x0;
  auVar1 = ZEXT464(0) << 0x40;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoGeneric_01186d30;
  (this->constraint).Cq_a = (ChRowVectorDynamic<double>)auVar1._0_16_;
  (this->constraint).Cq_b = (ChRowVectorDynamic<double>)auVar1._16_16_;
  (this->constraint).Eq_a = (ChVectorDynamic<double>)auVar1._32_16_;
  (this->constraint).Eq_b = (ChVectorDynamic<double>)auVar1._48_16_;
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->f_rot).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &(other->f_rot).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>);
  this->rot_offset = other->rot_offset;
  return;
}

Assistant:

ChShaftsMotorAngle::ChShaftsMotorAngle(const ChShaftsMotorAngle& other)
    : ChShaftsMotorBase(other), violation(0), motor_torque(0) {
    this->f_rot = other.f_rot;
    this->rot_offset = other.rot_offset;
}